

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

texture_type __thiscall
crnlib::mipmapped_texture::determine_texture_type(mipmapped_texture *this,bool no_normal_detection)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  byte in_SIL;
  mipmapped_texture *in_stack_00000048;
  undefined7 in_stack_ffffffffffffffe8;
  texture_type local_4;
  
  bVar1 = in_SIL & 1;
  bVar2 = is_valid((mipmapped_texture *)0x16d891);
  if (bVar2) {
    uVar3 = get_num_faces((mipmapped_texture *)0x16d8a9);
    if (uVar3 == 6) {
      local_4 = cTextureTypeCubemap;
    }
    else {
      bVar2 = is_vertical_cross((mipmapped_texture *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
      if (bVar2) {
        local_4 = cTextureTypeVerticalCrossCubemap;
      }
      else if (((bVar1 & 1) == 0) && (bVar2 = is_normal_map(in_stack_00000048), bVar2)) {
        local_4 = cTextureTypeNormalMap;
      }
      else {
        local_4 = cTextureTypeRegularMap;
      }
    }
  }
  else {
    local_4 = cTextureTypeUnknown;
  }
  return local_4;
}

Assistant:

texture_type mipmapped_texture::determine_texture_type(bool no_normal_detection) const {
  if (!is_valid())
    return cTextureTypeUnknown;

  if (get_num_faces() == 6)
    return cTextureTypeCubemap;
  else if (is_vertical_cross())
    return cTextureTypeVerticalCrossCubemap;
  else if (!no_normal_detection && is_normal_map())
    return cTextureTypeNormalMap;

  return cTextureTypeRegularMap;
}